

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::MatchExpr<duckdb_interval,_Catch::Matchers::Generic::PredicateMatcher<duckdb_interval>_>::
MatchExpr(MatchExpr<duckdb_interval,_Catch::Matchers::Generic::PredicateMatcher<duckdb_interval>_>
          *this,duckdb_interval *arg,PredicateMatcher<duckdb_interval> *matcher,
         StringRef *matcherString)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  
  iVar3 = (*(matcher->super_MatcherBase<duckdb_interval>).super_MatcherUntypedBase.
            _vptr_MatcherUntypedBase[3])(matcher);
  (this->super_ITransientExpression).m_isBinaryExpression = true;
  (this->super_ITransientExpression).m_result = SUB41(iVar3,0);
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_005cfb80;
  this->m_arg = arg;
  (this->m_matcher).super_MatcherBase<duckdb_interval>.super_MatcherUntypedBase.
  _vptr_MatcherUntypedBase = (_func_int **)&PTR__MatcherUntypedBase_005cadd0;
  (this->m_matcher).super_MatcherBase<duckdb_interval>.super_MatcherUntypedBase.m_cachedToString.
  _M_dataplus._M_p =
       (pointer)&(this->m_matcher).super_MatcherBase<duckdb_interval>.super_MatcherUntypedBase.
                 m_cachedToString.field_2;
  pcVar1 = (matcher->super_MatcherBase<duckdb_interval>).super_MatcherUntypedBase.m_cachedToString.
           _M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(this->m_matcher).super_MatcherBase<duckdb_interval>.super_MatcherUntypedBase.
              m_cachedToString,pcVar1,
             pcVar1 + (matcher->super_MatcherBase<duckdb_interval>).super_MatcherUntypedBase.
                      m_cachedToString._M_string_length);
  (this->m_matcher).super_MatcherBase<duckdb_interval>.super_MatcherUntypedBase.
  _vptr_MatcherUntypedBase = (_func_int **)&PTR__PredicateMatcher_005cfbc0;
  (this->m_matcher).super_MatcherBase<duckdb_interval>.super_MatcherMethod<duckdb_interval>.
  _vptr_MatcherMethod = (_func_int **)&DAT_005cfbf0;
  std::function<bool_(const_duckdb_interval_&)>::function
            (&(this->m_matcher).m_predicate,&matcher->m_predicate);
  (this->m_matcher).m_description._M_dataplus._M_p =
       (pointer)&(this->m_matcher).m_description.field_2;
  pcVar1 = (matcher->m_description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_matcher).m_description,pcVar1,
             pcVar1 + (matcher->m_description)._M_string_length);
  sVar2 = matcherString->m_size;
  (this->m_matcherString).m_start = matcherString->m_start;
  (this->m_matcherString).m_size = sVar2;
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}